

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O2

__m128i highbd_comp_mask_pred_line_sse2(__m128i s0,__m128i s1,__m128i a)

{
  longlong in_RAX;
  undefined1 in_XMM0 [16];
  undefined2 in_XMM1_Wa;
  undefined2 in_XMM1_Wb;
  undefined2 in_XMM1_Wc;
  undefined2 in_XMM1_Wd;
  undefined2 in_XMM1_We;
  undefined2 in_XMM1_Wf;
  undefined2 in_XMM1_Wg;
  undefined2 in_XMM1_Wh;
  undefined1 in_XMM2 [16];
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  __m128i alVar13;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  auVar12._0_12_ = in_XMM0._0_12_;
  auVar12._12_2_ = in_XMM0._6_2_;
  auVar12._14_2_ = in_XMM1_Wd;
  auVar11._12_4_ = auVar12._12_4_;
  auVar11._0_10_ = in_XMM0._0_10_;
  auVar11._10_2_ = in_XMM1_Wc;
  auVar10._10_6_ = auVar11._10_6_;
  auVar10._0_8_ = in_XMM0._0_8_;
  auVar10._8_2_ = in_XMM0._4_2_;
  auVar9._8_8_ = auVar10._8_8_;
  auVar9._6_2_ = in_XMM1_Wb;
  auVar9._4_2_ = in_XMM0._2_2_;
  auVar9._0_2_ = in_XMM0._0_2_;
  auVar9._2_2_ = in_XMM1_Wa;
  auVar6._0_12_ = in_XMM2._0_12_;
  auVar6._12_2_ = in_XMM2._6_2_;
  auVar6._14_2_ = 0x40 - in_XMM2._6_2_;
  auVar5._12_4_ = auVar6._12_4_;
  auVar5._0_10_ = in_XMM2._0_10_;
  auVar5._10_2_ = 0x40 - in_XMM2._4_2_;
  auVar4._10_6_ = auVar5._10_6_;
  auVar4._0_8_ = in_XMM2._0_8_;
  auVar4._8_2_ = in_XMM2._4_2_;
  auVar3._8_8_ = auVar4._8_8_;
  auVar3._6_2_ = 0x40 - in_XMM2._2_2_;
  auVar3._4_2_ = in_XMM2._2_2_;
  auVar3._2_2_ = 0x40 - in_XMM2._0_2_;
  auVar3._0_2_ = in_XMM2._0_2_;
  auVar7 = pmaddwd(auVar3,auVar9);
  auVar8._0_4_ = auVar7._0_4_ + 0x20 >> 6;
  auVar8._4_4_ = auVar7._4_4_ + 0x20 >> 6;
  auVar8._8_4_ = auVar7._8_4_ + 0x20 >> 6;
  auVar8._12_4_ = auVar7._12_4_ + 0x20 >> 6;
  auVar7._2_2_ = in_XMM1_We;
  auVar7._0_2_ = in_XMM0._8_2_;
  auVar7._4_2_ = in_XMM0._10_2_;
  auVar7._6_2_ = in_XMM1_Wf;
  auVar7._8_2_ = in_XMM0._12_2_;
  auVar7._10_2_ = in_XMM1_Wg;
  auVar7._12_2_ = in_XMM0._14_2_;
  auVar7._14_2_ = in_XMM1_Wh;
  auVar1._2_2_ = 0x40 - in_XMM2._8_2_;
  auVar1._0_2_ = in_XMM2._8_2_;
  auVar1._4_2_ = in_XMM2._10_2_;
  auVar1._6_2_ = 0x40 - in_XMM2._10_2_;
  auVar1._8_2_ = in_XMM2._12_2_;
  auVar1._10_2_ = 0x40 - in_XMM2._12_2_;
  auVar1._12_2_ = in_XMM2._14_2_;
  auVar1._14_2_ = 0x40 - in_XMM2._14_2_;
  auVar7 = pmaddwd(auVar1,auVar7);
  auVar2._0_4_ = auVar7._0_4_ + 0x20 >> 6;
  auVar2._4_4_ = auVar7._4_4_ + 0x20 >> 6;
  auVar2._8_4_ = auVar7._8_4_ + 0x20 >> 6;
  auVar2._12_4_ = auVar7._12_4_ + 0x20 >> 6;
  packssdw(auVar8,auVar2);
  alVar13[1] = s1[0];
  alVar13[0] = in_RAX;
  return alVar13;
}

Assistant:

static inline __m128i highbd_comp_mask_pred_line_sse2(const __m128i s0,
                                                      const __m128i s1,
                                                      const __m128i a) {
  const __m128i alpha_max = _mm_set1_epi16((1 << AOM_BLEND_A64_ROUND_BITS));
  const __m128i round_const =
      _mm_set1_epi32((1 << AOM_BLEND_A64_ROUND_BITS) >> 1);
  const __m128i a_inv = _mm_sub_epi16(alpha_max, a);

  const __m128i s_lo = _mm_unpacklo_epi16(s0, s1);
  const __m128i a_lo = _mm_unpacklo_epi16(a, a_inv);
  const __m128i pred_lo = _mm_madd_epi16(s_lo, a_lo);
  const __m128i pred_l = _mm_srai_epi32(_mm_add_epi32(pred_lo, round_const),
                                        AOM_BLEND_A64_ROUND_BITS);

  const __m128i s_hi = _mm_unpackhi_epi16(s0, s1);
  const __m128i a_hi = _mm_unpackhi_epi16(a, a_inv);
  const __m128i pred_hi = _mm_madd_epi16(s_hi, a_hi);
  const __m128i pred_h = _mm_srai_epi32(_mm_add_epi32(pred_hi, round_const),
                                        AOM_BLEND_A64_ROUND_BITS);

  const __m128i comp = _mm_packs_epi32(pred_l, pred_h);

  return comp;
}